

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadOptions.cpp
# Opt level: O0

HighsLoadOptionsStatus
loadOptionsFromFile(HighsLogOptions *report_log_options,HighsOptions *options,string *filename)

{
  byte bVar1;
  OptionStatus OVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  string *in_RDX;
  HighsLogOptions *in_RDI;
  size_t equals;
  ifstream file;
  string non_chars;
  HighsInt line_count;
  string value;
  string option;
  string line;
  string *in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffc50;
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [36];
  undefined4 local_2d4;
  long local_2d0;
  undefined1 local_2c8 [208];
  string *in_stack_fffffffffffffe08;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_stack_fffffffffffffe10;
  HighsLogOptions *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  HighsLogOptions *in_stack_fffffffffffffe28;
  allocator local_a9;
  string local_a8 [36];
  uint local_84;
  string local_80 [32];
  string local_60 [32];
  string local_40 [48];
  HighsLogOptions *local_10;
  HighsLoadOptionsStatus local_4;
  
  local_10 = in_RDI;
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0) {
    local_4 = kEmpty;
  }
  else {
    std::__cxx11::string::string(local_40);
    std::__cxx11::string::string(local_60);
    std::__cxx11::string::string(local_80);
    local_84 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"\t\n\v\f\r\"\' ",&local_a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::ifstream::ifstream(local_2c8,in_RDX,_S_in);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      highsLogUser(local_10,kError,"Options file not found\n");
      local_4 = kError;
    }
    else {
      do {
        do {
          bVar1 = std::ios::good();
          if ((bVar1 & 1) == 0) {
            local_4 = kOk;
            goto LAB_0047a679;
          }
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_2c8,local_40);
          local_84 = local_84 + 1;
          lVar3 = std::__cxx11::string::size();
        } while ((lVar3 == 0) ||
                (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar4 == '#')
                );
        local_2d0 = std::__cxx11::string::find_first_of((char *)local_40,0x8702cb);
        if ((local_2d0 == -1) ||
           (uVar5 = local_2d0 + 1, uVar6 = std::__cxx11::string::size(), uVar6 <= uVar5)) {
          highsLogUser(local_10,kError,"Error on line %d of options file.\n",(ulong)local_84);
          local_4 = kError;
          goto LAB_0047a679;
        }
        std::__cxx11::string::substr((ulong)local_2f8,(ulong)local_40);
        std::__cxx11::string::operator=(local_60,local_2f8);
        std::__cxx11::string::~string(local_2f8);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_318,(ulong)local_40);
        std::__cxx11::string::operator=(local_80,local_318);
        std::__cxx11::string::~string(local_318);
        trim(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        trim(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        std::__cxx11::string::string(local_338,local_80);
        OVar2 = setLocalOptionValue(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                                    in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                                    in_stack_fffffffffffffe08);
        std::__cxx11::string::~string(local_338);
      } while (OVar2 == kOk);
      uVar7 = std::__cxx11::string::c_str();
      uVar8 = std::__cxx11::string::c_str();
      highsLogUser(local_10,kError,"Cannot read value \"%s\" for option \"%s\"\n",uVar7,uVar8);
      local_4 = kError;
    }
LAB_0047a679:
    local_2d4 = 1;
    std::ifstream::~ifstream(local_2c8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
  }
  return local_4;
}

Assistant:

HighsLoadOptionsStatus loadOptionsFromFile(
    const HighsLogOptions& report_log_options, HighsOptions& options,
    const std::string filename) {
  if (filename.size() == 0) return HighsLoadOptionsStatus::kEmpty;

  string line, option, value;
  HighsInt line_count = 0;
  // loadOptionsFromFile needs its own non-chars string since the
  // default setting in io/stringutil.h excludes \" and \' that can
  // appear in an MPS name - the only other place where trim() is used
  const std::string non_chars = "\t\n\v\f\r\"\' ";
  std::ifstream file(filename);
  if (file.is_open()) {
    while (file.good()) {
      getline(file, line);
      line_count++;
      if (line.size() == 0 || line[0] == '#') continue;

      size_t equals = line.find_first_of("=");
      if (equals == std::string::npos || equals + 1 >= line.size()) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "Error on line %" HIGHSINT_FORMAT " of options file.\n",
                     line_count);
        return HighsLoadOptionsStatus::kError;
      }
      option = line.substr(0, equals);
      value = line.substr(equals + 1, line.size() - equals);
      trim(option, non_chars);
      trim(value, non_chars);
      if (setLocalOptionValue(report_log_options, option, options.log_options,
                              options.records, value) != OptionStatus::kOk) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "Cannot read value \"%s\" for option \"%s\"\n",
                     value.c_str(), option.c_str());
        return HighsLoadOptionsStatus::kError;
      }
    }
  } else {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "Options file not found\n");
    return HighsLoadOptionsStatus::kError;
  }

  return HighsLoadOptionsStatus::kOk;
}